

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O1

cio_error cio_buffered_stream_read_at_least
                    (cio_buffered_stream *buffered_stream,cio_read_buffer *buffer,size_t num,
                    cio_buffered_stream_read_handler_t handler,void *handler_context)

{
  cio_error cVar1;
  
  cVar1 = CIO_INVALID_ARGUMENT;
  if (((buffer != (cio_read_buffer *)0x0) && (buffered_stream != (cio_buffered_stream *)0x0)) &&
     (handler != (cio_buffered_stream_read_handler_t)0x0)) {
    if ((ulong)((long)buffer->end - (long)buffer->data) < num) {
      cVar1 = CIO_MESSAGE_TOO_LONG;
    }
    else {
      (buffered_stream->read_info).bytes_to_read = num;
      buffered_stream->read_job = internal_read_at_least;
      buffered_stream->read_buffer = buffer;
      buffered_stream->read_handler = handler;
      buffered_stream->read_handler_context = handler_context;
      buffered_stream->last_error = CIO_SUCCESS;
      cVar1 = CIO_SUCCESS;
      if (buffered_stream->callback_is_running == 0) {
        run_read(buffered_stream);
      }
    }
  }
  return cVar1;
}

Assistant:

enum cio_error cio_buffered_stream_read_at_least(struct cio_buffered_stream *buffered_stream, struct cio_read_buffer *buffer, size_t num, cio_buffered_stream_read_handler_t handler, void *handler_context)
{
	if (cio_unlikely((buffered_stream == NULL) || (handler == NULL) || (buffer == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely(num > cio_read_buffer_size(buffer))) {
		return CIO_MESSAGE_TOO_LONG;
	}

	buffered_stream->read_info.bytes_to_read = num;
	buffered_stream->read_job = internal_read_at_least;
	buffered_stream->read_buffer = buffer;
	buffered_stream->read_handler = handler;
	buffered_stream->read_handler_context = handler_context;
	buffered_stream->last_error = CIO_SUCCESS;
	start_read(buffered_stream);

	return CIO_SUCCESS;
}